

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboCompletenessTests.cpp
# Opt level: O2

string * __thiscall
deqp::gls::fboc::details::RenderableParams::getDescription_abi_cxx11_
          (string *__return_storage_ptr__,RenderableParams *this,RenderableParams *params)

{
  ImageFormat IVar1;
  char *pcVar2;
  string typeStr;
  string fmtStr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  IVar1 = this->format;
  pcVar2 = glu::getTextureFormatName(IVar1.format);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,pcVar2,(allocator<char> *)&local_50);
  if ((ulong)IVar1 >> 0x20 == 0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&local_30);
  }
  else {
    pcVar2 = glu::getTypeName(IVar1.unsizedType);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,pcVar2,(allocator<char> *)&local_70);
    std::operator+(&local_70,&local_30," with type ");
    std::operator+(__return_storage_ptr__,&local_70,&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
  }
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

static string		getDescription		(const RenderableParams& params)
	{
		return formatDesc(params.format);
	}